

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

void absl::lts_20250127::StrAppend
               (Nonnull<std::string_*> dest,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  bool bVar1;
  size_type sVar2;
  Nullable<const_char_*> pcVar3;
  long lVar4;
  ulong uVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  long lVar9;
  Nonnull<char_*> pcVar10;
  char *out;
  char *begin;
  size_type old_size;
  AlphaNum *d_local;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  Nonnull<std::string_*> dest_local;
  
  sVar2 = AlphaNum::size(a);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data(a);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/str_cat.cc"
                  ,0xe2,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = AlphaNum::size(b);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data(b);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((b).size() == 0) || (uintptr_t((b).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/str_cat.cc"
                  ,0xe3,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = AlphaNum::size(c);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data(c);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((c).size() == 0) || (uintptr_t((c).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/str_cat.cc"
                  ,0xe4,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = AlphaNum::size(d);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data(d);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((d).size() == 0) || (uintptr_t((d).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/str_cat.cc"
                  ,0xe5,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  lVar4 = std::__cxx11::string::size();
  sVar2 = AlphaNum::size(a);
  sVar6 = AlphaNum::size(b);
  sVar7 = AlphaNum::size(c);
  sVar8 = AlphaNum::size(d);
  anon_unknown_5::STLStringAppendUninitializedAmortized(dest,sVar2 + sVar6 + sVar7 + sVar8);
  lVar9 = std::__cxx11::string::operator[]((ulong)dest);
  pcVar10 = anon_unknown_5::Append((Nonnull<char_*>)(lVar9 + lVar4),a);
  pcVar10 = anon_unknown_5::Append(pcVar10,b);
  pcVar10 = anon_unknown_5::Append(pcVar10,c);
  pcVar10 = anon_unknown_5::Append(pcVar10,d);
  lVar4 = std::__cxx11::string::size();
  if (pcVar10 == (Nonnull<char_*>)(lVar9 + lVar4)) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/str_cat.cc"
                ,0xef,
                "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

void StrAppend(absl::Nonnull<std::string*> dest, const AlphaNum& a,
               const AlphaNum& b, const AlphaNum& c, const AlphaNum& d) {
  ASSERT_NO_OVERLAP(*dest, a);
  ASSERT_NO_OVERLAP(*dest, b);
  ASSERT_NO_OVERLAP(*dest, c);
  ASSERT_NO_OVERLAP(*dest, d);
  std::string::size_type old_size = dest->size();
  STLStringAppendUninitializedAmortized(
      dest, a.size() + b.size() + c.size() + d.size());
  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  out = Append(out, d);
  assert(out == begin + dest->size());
}